

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  DiskFileToVirtualFileResult DVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  byte bVar9;
  byte bVar10;
  string_view disk_file;
  string_view virtual_file_00;
  string_view virtual_file_01;
  string error_str;
  string virtual_file;
  string shadowing_disk_file;
  FileDescriptorProto fallback_file;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  long *local_148;
  long local_140;
  long local_138 [2];
  FileDescriptorProto local_128;
  
  bVar9 = 0;
  FileDescriptorProto::FileDescriptorProto(&local_128,(Arena *)0x0);
  if (fallback_database != (DescriptorDatabase *)0x0) {
    iVar3 = (*fallback_database->_vptr_DescriptorDatabase[2])(fallback_database,proto,&local_128);
    bVar9 = (byte)iVar3;
  }
  iVar3 = access((proto->_M_dataplus)._M_p,0);
  paVar1 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar1;
  if (iVar3 < 0) {
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    virtual_file_00._M_str = (proto->_M_dataplus)._M_p;
    virtual_file_00._M_len = proto->_M_string_length;
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,virtual_file_00,&local_188);
    bVar10 = bVar9 | bVar2;
    if (bVar10 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not make proto path relative: ",0x24);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      pcVar6 = strerror(2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_001d8561;
  }
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  disk_file._M_str = (proto->_M_dataplus)._M_p;
  disk_file._M_len = proto->_M_string_length;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  DVar4 = DiskSourceTree::DiskFileToVirtualFile(source_tree,disk_file,&local_188,&local_168);
  bVar10 = 1;
  switch(DVar4) {
  case SUCCESS:
    std::__cxx11::string::_M_assign((string *)proto);
    break;
  case SHADOWED:
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,": Input is shadowed in the --proto_path by \"",0x2c);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
               ,0x78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
LAB_001d852f:
    bVar10 = 0;
    break;
  case CANNOT_OPEN:
    if (bVar9 == 0) {
      (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(&local_148,source_tree);
      if (local_140 == 0) {
        piVar8 = __errno_location();
        pcVar6 = strerror(*piVar8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar6,&local_1a9);
      }
      else {
        (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(&local_1a8,source_tree);
      }
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not map to virtual file: ",0x1f);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001d852f;
    }
    break;
  case NO_MAPPING:
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_local_buf[0] = '\0';
    virtual_file_01._M_str = (proto->_M_dataplus)._M_p;
    virtual_file_01._M_len = proto->_M_string_length;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,virtual_file_01,&local_1a8);
    bVar10 = bVar9 | bVar2;
    if (bVar10 == 0) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                 ,0x152);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                               local_1a8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
LAB_001d8561:
  FileDescriptorProto::~FileDescriptorProto(&local_128);
  return (bool)bVar10;
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << "Could not make proto path relative: " << *proto << ": "
                << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN: {
      if (in_fallback_database) {
        return true;
      }
      std::string error_str = source_tree->GetLastErrorMessage().empty()
                                  ? strerror(errno)
                                  : source_tree->GetLastErrorMessage();
      std::cerr << "Could not map to virtual file: " << *proto << ": "
                << error_str << std::endl;
      return false;
    }
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}